

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_evaluateSolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Result simplificationStatus)

{
  type_conflict5 tVar1;
  Status SVar2;
  SPxOut *pSVar3;
  Settings *pSVar4;
  Verbosity old_verbosity;
  Verbosity VVar5;
  bool bVar6;
  char *t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_60;
  
  if (simplificationStatus - INFEASIBLE < 3) {
    this->_hasBasis = false;
    if (this->_currentSettings->_boolParamValues[0xb] != true) {
      SVar2 = INFEASIBLE;
      if (simplificationStatus != INFEASIBLE) {
        SVar2 = (uint)(simplificationStatus != UNBOUNDED) * 2 + UNBOUNDED;
      }
      this->_status = SVar2;
      _loadRealLP(this,false);
      return;
    }
    VVar5 = (this->spxout).m_verbosity;
    if ((int)VVar5 < 3) goto LAB_002ad69c;
    (this->spxout).m_verbosity = INFO1;
    t = "simplifier detected infeasibility or unboundedness - solve again without simplifying";
LAB_002ad684:
    pSVar3 = soplex::operator<<(&this->spxout,t);
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    (this->spxout).m_verbosity = VVar5;
LAB_002ad69c:
    _preprocessAndSolveReal(this,false,(bool *)0x0);
    return;
  }
  if (simplificationStatus == OKAY) {
    SVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::status(&this->_solver);
    this->_status = SVar2;
  }
  else {
    if (simplificationStatus == VANISHED) {
      this->_status = OPTIMAL;
      _storeSolutionRealFromPresol(this);
      return;
    }
    SVar2 = this->_status;
  }
  switch(SVar2) {
  case OPTIMAL:
    _storeSolutionReal(this,(bool)((~this->_isRealLPLoaded | this->_isRealLPScaled) & 1));
    if (this->_applyPolishing != true) {
      return;
    }
    setIntParam(this,SOLUTION_POLISHING,this->_currentSettings->_intParamValues[0x17],true);
    goto LAB_002ad69c;
  case UNBOUNDED:
  case INFEASIBLE:
  case INForUNBD:
    if ((this->_isRealLPLoaded == false) &&
       (pSVar4 = this->_currentSettings, pSVar4->_boolParamValues[0xb] == true)) {
      VVar5 = (this->spxout).m_verbosity;
      if (2 < (int)VVar5) {
        (this->spxout).m_verbosity = INFO1;
        pSVar3 = soplex::operator<<(&this->spxout," --- loading original problem");
        std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
        (this->spxout).m_verbosity = VVar5;
        pSVar4 = this->_currentSettings;
      }
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 &(this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .offset,pSVar4->_realParamValues[0x17]);
      _resolveWithoutPreprocessing(this,simplificationStatus);
      return;
    }
    bVar6 = false;
LAB_002ad8ae:
    _storeSolutionReal(this,bVar6);
    return;
  case ABORT_CYCLING:
    if ((this->_isRealLPLoaded != true) || (this->_isRealLPScaled == true)) {
      VVar5 = (this->spxout).m_verbosity;
      if (2 < (int)VVar5) {
        (this->spxout).m_verbosity = INFO1;
        pSVar3 = soplex::operator<<(&this->spxout,
                                    "encountered cycling - trying to solve again without simplifying"
                                   );
        std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
        (this->spxout).m_verbosity = VVar5;
      }
      bVar6 = true;
      goto LAB_002ad8ae;
    }
    if (((this->_solReal).field_0xc8 & 5) != 0) {
      this->_status = OPTIMAL_UNSCALED_VIOLATIONS;
    }
  case ABORT_TIME:
  case ABORT_ITER:
  case REGULAR:
  case RUNNING:
    local_98.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 8);
    local_98.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(this->_solver).theShift.m_backend.data._M_elems;
    local_98.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 2);
    local_98.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 4);
    local_98.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 6);
    local_98.m_backend.exp = (this->_solver).theShift.m_backend.exp;
    local_98.m_backend.neg = (this->_solver).theShift.m_backend.neg;
    local_98.m_backend.fpclass = (this->_solver).theShift.m_backend.fpclass;
    local_98.m_backend.prec_elem = (this->_solver).theShift.m_backend.prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon(&local_60,&this->_solver);
    tVar1 = boost::multiprecision::operator>(&local_98,&local_60);
    if (tVar1) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasisStatus(&this->_solver,REGULAR);
    }
    bVar6 = false;
LAB_002ad7c2:
    _storeSolutionReal(this,bVar6);
    break;
  case ABORT_VALUE:
    local_98.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 8);
    local_98.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(this->_solver).theShift.m_backend.data._M_elems;
    local_98.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 2);
    local_98.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 4);
    local_98.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 6);
    local_98.m_backend.exp = (this->_solver).theShift.m_backend.exp;
    local_98.m_backend.neg = (this->_solver).theShift.m_backend.neg;
    local_98.m_backend.fpclass = (this->_solver).theShift.m_backend.fpclass;
    local_98.m_backend.prec_elem = (this->_solver).theShift.m_backend.prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon(&local_60,&this->_solver);
    tVar1 = boost::multiprecision::operator>(&local_98,&local_60);
    if (tVar1) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasisStatus(&this->_solver,REGULAR);
    }
    bVar6 = true;
    goto LAB_002ad7c2;
  case SINGULAR:
    if (this->_isRealLPLoaded == false) {
      VVar5 = (this->spxout).m_verbosity;
      if ((int)VVar5 < 3) goto LAB_002ad69c;
      (this->spxout).m_verbosity = INFO1;
      t = "encountered singularity - trying to solve again without simplifying";
      goto LAB_002ad684;
    }
  default:
    this->_hasBasis = false;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_evaluateSolutionReal(typename SPxSimplifier<R>::Result simplificationStatus)
{
   // if the simplifier detected infeasibility or unboundedness we optimize again
   // just to get the proof (primal or dual ray)
   // todo get infeasibility proof from simplifier
   switch(simplificationStatus)
   {
   case SPxSimplifier<R>::INFEASIBLE:
   case SPxSimplifier<R>::DUAL_INFEASIBLE:
   case SPxSimplifier<R>::UNBOUNDED:
      _hasBasis = false;

      if(boolParam(SoPlexBase<R>::ENSURERAY))
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "simplifier detected infeasibility or unboundedness - solve again without simplifying" << std::endl;
                      )
         _preprocessAndSolveReal(false);
      }
      else
      {
         if(simplificationStatus == SPxSimplifier<R>::INFEASIBLE)
            _status = SPxSolverBase<R>::INFEASIBLE;
         else if(simplificationStatus == SPxSimplifier<R>::UNBOUNDED)
            _status = SPxSolverBase<R>::UNBOUNDED;
         else
            _status = SPxSolverBase<R>::INForUNBD;

         // load original LP to restore clean solver state
         _loadRealLP(false);
      }

      return;

   case SPxSimplifier<R>::VANISHED:
      _status = SPxSolverBase<R>::OPTIMAL;
      _storeSolutionRealFromPresol();
      return;

   case SPxSimplifier<R>::OKAY:
      _status = _solver.status();
   }

   // process result
   switch(_status)
   {
   case SPxSolverBase<R>::OPTIMAL:
      _storeSolutionReal(!_isRealLPLoaded || _isRealLPScaled);

      // apply polishing on original problem
      if(_applyPolishing)
      {
         int polishing = intParam(SoPlexBase<R>::SOLUTION_POLISHING);
         setIntParam(SoPlexBase<R>::SOLUTION_POLISHING, polishing);
         _preprocessAndSolveReal(false);
      }

      break;

   case SPxSolverBase<R>::UNBOUNDED:
   case SPxSolverBase<R>::INFEASIBLE:
   case SPxSolverBase<R>::INForUNBD:

      // in case of infeasibility or unboundedness, we currently can not unsimplify, but have to solve the original LP again
      if(!_isRealLPLoaded && boolParam(SoPlexBase<R>::ENSURERAY))
      {
         SPX_MSG_INFO1(spxout, spxout << " --- loading original problem" << std::endl;)
         _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
         // we cannot do more to remove violations
         _resolveWithoutPreprocessing(simplificationStatus);
      }
      else
      {
         _storeSolutionReal(false);
      }

      break;

   case SPxSolverBase<R>::SINGULAR:

      // if preprocessing was applied, try to run again without to avoid singularity
      if(!_isRealLPLoaded)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "encountered singularity - trying to solve again without simplifying" <<
                       std::endl;)
         _preprocessAndSolveReal(false);
         return;
      }

      _hasBasis = false;
      break;

   case SPxSolverBase<R>::ABORT_VALUE:

      // If we aborted the solve for some reason and there is still a shift, ensure that the basis status is correct
      if(_solver.shift() > _solver.epsilon())
         _solver.setBasisStatus(SPxBasisBase<R>::REGULAR);

      _storeSolutionReal(true);
      break;

   case SPxSolverBase<R>::ABORT_CYCLING:

      // if preprocessing or scaling was applied, try to run again without to
      // avoid cycling
      if(!_isRealLPLoaded || _isRealLPScaled)
      {
         SPX_MSG_INFO1(spxout, spxout << "encountered cycling - trying to solve again without simplifying" <<
                       std::endl;)
         // store and unsimplify sub-optimal solution and basis, may trigger re-solve
         _storeSolutionReal(true);
         return;
      }

      if(_solReal.isPrimalFeasible() || _solReal.isDualFeasible())
         _status = SPxSolverBase<R>::OPTIMAL_UNSCALED_VIOLATIONS;

   // FALLTHROUGH
   case SPxSolverBase<R>::ABORT_TIME:
   case SPxSolverBase<R>::ABORT_ITER:
   case SPxSolverBase<R>::REGULAR:
   case SPxSolverBase<R>::RUNNING:

      // If we aborted the solve for some reason and there is still a shift, ensure that the basis status is correct
      if(_solver.shift() > _solver.epsilon())
         _solver.setBasisStatus(SPxBasisBase<R>::REGULAR);

      _storeSolutionReal(false);
      break;

   default:
      _hasBasis = false;
      break;
   }
}